

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midiclock.cpp
# Opt level: O0

int main(int param_1,char **argv)

{
  char *__s;
  long lVar1;
  ostream *poVar2;
  allocator<char> local_39;
  string local_38 [8];
  string prog;
  char **argv_local;
  int param_0_local;
  
  __s = *argv;
  prog.field_2._8_8_ = argv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_38,__s,&local_39);
  std::allocator<char>::~allocator(&local_39);
  lVar1 = std::__cxx11::string::find((char *)local_38,0x10611d);
  if (lVar1 == -1) {
    lVar1 = std::__cxx11::string::find((char *)local_38,0x10612a);
    if (lVar1 == -1) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Don\'t know what to do as ");
      poVar2 = std::operator<<(poVar2,local_38);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    else {
      clock_out();
    }
  }
  else {
    clock_in();
  }
  std::__cxx11::string::~string(local_38);
  return 0;
}

Assistant:

int main( int, const char *argv[] )
{
  std::string prog(argv[0]);
  if (prog.find("midiclock_in") != prog.npos) {
    clock_in();
  }
  else if (prog.find("midiclock_out") != prog.npos) {
    clock_out();
  }
  else {
    std::cout << "Don't know what to do as " << prog << std::endl;
  }
  return 0;
}